

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_results.hpp
# Opt level: O1

void __thiscall
boost::xpressive::match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
format_all_impl_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::noop_output_iterator<char>>
          (match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *cur,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               end,uint param_4)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  int iVar4;
  regex_error local_68;
  
  do {
    while( true ) {
      pbVar3 = (byte *)cur->_M_current;
      if (pbVar3 == (byte *)end._M_current) {
        return;
      }
      bVar2 = *pbVar3;
      if (0x39 < bVar2) break;
      if (bVar2 == 0x24) {
        cur->_M_current = (char *)(pbVar3 + 1);
        format_backref_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::noop_output_iterator<char>>
                  (this,cur,end._M_current);
      }
      else if (bVar2 == 0x28) {
        cur->_M_current = (char *)(pbVar3 + 1);
        format_all_impl_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::noop_output_iterator<char>>
                  (this,cur,end._M_current,0);
        if (cur->_M_current[-1] != ')') {
          std::runtime_error::runtime_error
                    (&local_68.super_runtime_error,"unbalanced parentheses in format string");
          local_68.super_exception.data_.px_ = (error_info_container *)0x0;
          local_68._0_8_ = &PTR__regex_error_00195328;
          local_68.super_exception._vptr_exception = (_func_int **)&PTR__regex_error_00195350;
          local_68.code_ = error_paren;
          local_68.super_exception.throw_function_ =
               "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_all_impl_(ForwardIterator &, ForwardIterator, OutputIterator, bool) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = boost::xpressive::detail::noop_output_iterator<char>]"
          ;
          local_68.super_exception.throw_file_ =
               "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/match_results.hpp"
          ;
          local_68.super_exception.throw_line_ = 0x43b;
          local_68.super_exception.throw_column_ = -1;
          throw_exception<boost::xpressive::regex_error>(&local_68);
        }
      }
      else {
        if (bVar2 == 0x29) {
LAB_00140789:
          cur->_M_current = (char *)(pbVar3 + 1);
          return;
        }
LAB_0014071a:
        cur->_M_current = (char *)(pbVar3 + 1);
      }
    }
    if (bVar2 == 0x3a) {
      if ((param_4 & 1) != 0) goto LAB_00140789;
      goto LAB_0014071a;
    }
    if (bVar2 == 0x5c) {
      pbVar1 = pbVar3 + 1;
      cur->_M_current = (char *)pbVar1;
      if ((pbVar1 == (byte *)end._M_current) || (*pbVar1 != 0x67)) {
        format_escape_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::noop_output_iterator<char>>
                  (this,cur,end._M_current);
      }
      else {
        cur->_M_current = (char *)(pbVar3 + 2);
        format_named_backref_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::noop_output_iterator<char>>
                  (this,cur,end._M_current);
      }
    }
    else {
      if (bVar2 != 0x3f) goto LAB_0014071a;
      cur->_M_current = (char *)(pbVar3 + 1);
      if (pbVar3 + 1 == (byte *)end._M_current) {
        std::runtime_error::runtime_error
                  (&local_68.super_runtime_error,"malformed conditional in format string");
        local_68.super_exception.data_.px_ = (error_info_container *)0x0;
        local_68._0_8_ = &PTR__regex_error_00195328;
        local_68.super_exception._vptr_exception = (_func_int **)&PTR__regex_error_00195350;
        local_68.code_ = error_subreg;
        local_68.super_exception.throw_function_ =
             "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_all_impl_(ForwardIterator &, ForwardIterator, OutputIterator, bool) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = boost::xpressive::detail::noop_output_iterator<char>]"
        ;
        local_68.super_exception.throw_file_ =
             "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/match_results.hpp"
        ;
        local_68.super_exception.throw_line_ = 0x440;
        local_68.super_exception.throw_column_ = -1;
        throw_exception<boost::xpressive::regex_error>(&local_68);
      }
      iVar4 = detail::
              toi<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::traits<char>>
                        (cur,end,*(traits<char> **)(this + 0x80),10,*(int *)(this + 8) + -1);
      if (iVar4 == 0) {
        std::runtime_error::runtime_error(&local_68.super_runtime_error,"invalid back-reference");
        local_68.super_exception.data_.px_ = (error_info_container *)0x0;
        local_68._0_8_ = &PTR__regex_error_00195328;
        local_68.super_exception._vptr_exception = (_func_int **)&PTR__regex_error_00195350;
        local_68.code_ = error_subreg;
        local_68.super_exception.throw_function_ =
             "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_all_impl_(ForwardIterator &, ForwardIterator, OutputIterator, bool) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = boost::xpressive::detail::noop_output_iterator<char>]"
        ;
        local_68.super_exception.throw_file_ =
             "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/match_results.hpp"
        ;
        local_68.super_exception.throw_line_ = 0x443;
        local_68.super_exception.throw_column_ = -1;
        throw_exception<boost::xpressive::regex_error>(&local_68);
      }
      detail::
      sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)(this + 8),(long)iVar4);
      format_all_impl_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::noop_output_iterator<char>>
                (this,cur,end._M_current,1);
      param_4 = 0;
      if (cur->_M_current[-1] != ':') {
        return;
      }
    }
  } while( true );
}

Assistant:

OutputIterator format_all_impl_(ForwardIterator &cur, ForwardIterator end, OutputIterator out, bool metacolon = false) const
    {
        int max = 0, sub = 0;
        detail::noop_output_iterator<char_type> noop;

        while(cur != end)
        {
            switch(*cur)
            {
            case BOOST_XPR_CHAR_(char_type, '$'):
                out = this->format_backref_(++cur, end, out);
                break;

            case BOOST_XPR_CHAR_(char_type, '\\'):
                if(++cur != end && BOOST_XPR_CHAR_(char_type, 'g') == *cur)
                {
                    out = this->format_named_backref_(++cur, end, out);
                }
                else
                {
                    out = this->format_escape_(cur, end, out);
                }
                break;

            case BOOST_XPR_CHAR_(char_type, '('):
                out = this->format_all_impl_(++cur, end, out);
                BOOST_XPR_ENSURE_(BOOST_XPR_CHAR_(char_type, ')') == *(cur-1)
                  , regex_constants::error_paren, "unbalanced parentheses in format string");
                break;

            case BOOST_XPR_CHAR_(char_type, '?'):
                BOOST_XPR_ENSURE_(++cur != end
                  , regex_constants::error_subreg, "malformed conditional in format string");
                max = static_cast<int>(this->size() - 1);
                sub = detail::toi(cur, end, *this->traits_, 10, max);
                BOOST_XPR_ENSURE_(0 != sub, regex_constants::error_subreg, "invalid back-reference");
                if(this->sub_matches_[ sub ].matched)
                {
                    out = this->format_all_impl_(cur, end, out, true);
                    if(BOOST_XPR_CHAR_(char_type, ':') == *(cur-1))
                        this->format_all_impl_(cur, end, noop);
                }
                else
                {
                    this->format_all_impl_(cur, end, noop, true);
                    if(BOOST_XPR_CHAR_(char_type, ':') == *(cur-1))
                        out = this->format_all_impl_(cur, end, out);
                }
                return out;

            case BOOST_XPR_CHAR_(char_type, ':'):
                if(metacolon)
                {
                    BOOST_FALLTHROUGH;
            case BOOST_XPR_CHAR_(char_type, ')'):
                    ++cur;
                    return out;
                }
                BOOST_FALLTHROUGH;

            default:
                *out++ = *cur++;
                break;
            }
        }

        return out;
    }